

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O2

void __thiscall
boost::ext::di::v1_2_0::core::
injector<boost::ext::di::v1_2_0::config,boost::ext::di::v1_2_0::core::pool<boost::ext::di::v1_2_0::aux::type_list<>>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,ILogger,ConsoleLogger,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,Engine,std::shared_ptr<Engine>,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>>
::
injector<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,ILogger,ConsoleLogger,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,Engine,std::shared_ptr<Engine>,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>>
          (injector<boost::ext::di::v1_2_0::config,boost::ext::di::v1_2_0::core::pool<boost::ext::di::v1_2_0::aux::type_list<>>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,ILogger,ConsoleLogger,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,Engine,std::shared_ptr<Engine>,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>>
           *this,undefined8 param_2,undefined8 *param_3)

{
  undefined1 local_19;
  undefined4 local_18;
  undefined4 uStack_14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  local_18 = *(undefined4 *)param_3;
  uStack_14 = *(undefined4 *)((long)param_3 + 4);
  _Stack_10._M_pi._0_4_ = *(undefined4 *)(param_3 + 1);
  _Stack_10._M_pi._4_4_ = *(undefined4 *)((long)param_3 + 0xc);
  param_3[1] = 0;
  *param_3 = 0;
  injector<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,ILogger,ConsoleLogger,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,Engine,std::shared_ptr<Engine>,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>>
            (this,&local_19,&local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  return;
}

Assistant:

operator T*() const {
      using constraint_not_satisfied = is_not_bound;
      return constraint_not_satisfied{}.error();
    }